

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O2

bool __thiscall wasm::DAE::iteration(DAE *this,Module *module)

{
  Index x;
  pointer puVar1;
  pointer puVar2;
  Export *pEVar3;
  _Base_ptr p_Var4;
  _Base_ptr *calls;
  __buckets_ptr pp_Var5;
  Module *pMVar6;
  bool bVar7;
  mapped_type *pmVar8;
  vector<wasm::Call*,std::allocator<wasm::Call*>> *this_00;
  mapped_type *pppEVar9;
  Function *pFVar10;
  undefined8 extraout_RAX;
  _Rb_tree_node_base *p_Var11;
  size_t sVar12;
  _Base_ptr p_Var13;
  size_type sVar14;
  iterator iVar15;
  _Rb_tree_node_base *p_Var16;
  __buckets_ptr pp_Var17;
  __node_base_ptr *pp_Var18;
  pointer puVar19;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar20;
  ulong uVar21;
  initializer_list<wasm::Function_*> __l;
  initializer_list<wasm::Function_*> __l_00;
  Signature SVar22;
  undefined1 local_3d8 [8];
  DAEScanner scanner;
  unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
  changed;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_178;
  undefined1 local_160 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  tailCallees;
  DAEFunctionInfoMap infoMap;
  map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
  allCalls;
  _Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> local_b8;
  undefined1 auStack_98 [8];
  SortedVector removedIndexes;
  _Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_> local_78;
  Function *local_60;
  Function *func_1;
  anon_class_8_1_8991fb9c local_50;
  _Rb_tree_node_base *local_48;
  Module *local_40;
  byte local_31;
  
  local_50.this = this;
  std::
  _Hashtable<wasm::Call_*,_std::pair<wasm::Call_*const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Call_*>,_std::hash<wasm::Call_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->allDroppedCalls)._M_h);
  tailCallees._M_h._M_single_bucket = (__node_base_ptr)&infoMap._M_h._M_rehash_policy._M_next_resize
  ;
  infoMap._M_h._M_buckets = (__buckets_ptr)0x1;
  local_48 = (_Rb_tree_node_base *)&infoMap._M_h._M_bucket_count;
  infoMap._M_h._M_bucket_count = 0;
  infoMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  infoMap._M_h._M_element_count._0_4_ = 0x3f800000;
  infoMap._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  infoMap._M_h._M_rehash_policy._4_4_ = 0;
  infoMap._M_h._M_rehash_policy._M_next_resize = 0;
  puVar1 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
  super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.currModule =
       (Module *)&tailCallees._M_h._M_single_bucket;
  local_40 = module;
  for (puVar19 = (module->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pMVar6 = local_40, puVar19 != puVar1;
      puVar19 = puVar19 + 1) {
    std::__detail::
    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)scanner.
                    super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                    .super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                    super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
                    currModule,
                 (key_type *)
                 (puVar19->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
  }
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_Pass.runner =
       (PassRunner *)
       &scanner.
        super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
        .super_Pass.name._M_string_length;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_Pass._vptr_Pass = (_func_int **)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_Pass.name._M_dataplus._M_p = (pointer)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_Pass.name._M_string_length._0_1_ = 0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_Pass.name.field_2._8_8_ = 0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
  super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.replacep =
       (Expression **)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
  super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.stack.fixed._M_elems[9].
  currp = (Expression **)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
  super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
  super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
  super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scanner.
  super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>.
  super_PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.
  super_Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>.currFunction =
       (Function *)0x0;
  local_3d8 = (undefined1  [8])&PTR__WalkerPass_00e1dff8;
  Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::walkModuleCode
            ((Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_> *)
             ((long)&scanner.
                     super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                     .super_Pass.name.field_2 + 8),local_40);
  puVar2 = (pMVar6->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar20 = (pMVar6->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar20 != puVar2; puVar20 = puVar20 + 1
      ) {
    pEVar3 = (puVar20->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
             super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
    if (pEVar3->kind == Function) {
      pmVar8 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&tailCallees._M_h._M_single_bucket,&pEVar3->value);
      LOCK();
      (pmVar8->hasUnseenCalls)._M_base._M_i = true;
      UNLOCK();
    }
  }
  WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>::run
            ((WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
              *)local_3d8,((local_50.this)->super_Pass).runner,local_40);
  allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&allCalls;
  allCalls._M_t._M_impl._0_4_ = 0;
  allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  allCalls._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_160 = (undefined1  [8])&tailCallees._M_h._M_rehash_policy._M_next_resize;
  tailCallees._M_h._M_buckets = (__buckets_ptr)0x1;
  tailCallees._M_h._M_bucket_count = 0;
  tailCallees._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  tailCallees._M_h._M_element_count._0_4_ = 0x3f800000;
  tailCallees._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  tailCallees._M_h._M_rehash_policy._4_4_ = 0;
  tailCallees._M_h._M_rehash_policy._M_next_resize = 0;
  allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  while (p_Var11 = *(_Rb_tree_node_base **)&local_48->_M_color, p_Var11 != (_Rb_tree_node_base *)0x0
        ) {
    p_Var16 = p_Var11 + 2;
    local_48 = p_Var11;
    while (p_Var16 = *(_Rb_tree_node_base **)p_Var16, p_Var16 != (_Rb_tree_node_base *)0x0) {
      this_00 = (vector<wasm::Call*,std::allocator<wasm::Call*>> *)
                std::
                map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                ::operator[]((map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                              *)&infoMap._M_h._M_single_bucket,(key_type *)&p_Var16->_M_parent);
      std::vector<wasm::Call*,std::allocator<wasm::Call*>>::
      insert<__gnu_cxx::__normal_iterator<wasm::Call**,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>,void>
                (this_00,(const_iterator)*(Call ***)(this_00 + 8),
                 (__normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                  )p_Var16->_M_right,
                 (__normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                  )*(Call ***)(p_Var16 + 1));
    }
    p_Var13 = (_Base_ptr)&local_48[5]._M_right;
    while (p_Var13 = *(_Base_ptr *)p_Var13, p_Var13 != (_Base_ptr)0x0) {
      std::__detail::
      _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)local_160,(value_type *)&p_Var13->_M_parent);
    }
    p_Var13 = (_Base_ptr)&local_48[3]._M_right;
    while (p_Var13 = *(_Base_ptr *)p_Var13, p_Var13 != (_Base_ptr)0x0) {
      p_Var4 = p_Var13->_M_left;
      pppEVar9 = std::__detail::
                 _Map_base<wasm::Call_*,_std::pair<wasm::Call_*const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Call_*>,_std::hash<wasm::Call_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::Call_*,_std::pair<wasm::Call_*const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Call_*>,_std::hash<wasm::Call_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->allDroppedCalls,(key_type *)&p_Var13->_M_parent);
      *pppEVar9 = (mapped_type)p_Var4;
    }
  }
  uVar21 = 0;
  pp_Var18 = &tailCallees._M_h._M_single_bucket;
  for (p_Var11 = allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var11 != (_Rb_tree_node_base *)&allCalls;
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
    p_Var16 = p_Var11 + 1;
    pmVar8 = std::__detail::
             _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)pp_Var18,(key_type *)p_Var16);
    if (((pmVar8->hasUnseenCalls)._M_base._M_i & 1U) == 0) {
      local_48 = p_Var11;
      pFVar10 = Module::getFunction(local_40,(IString)*(IString *)(p_Var11 + 1));
      pmVar8 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)pp_Var18,(key_type *)p_Var16);
      calls = &local_48[1]._M_left;
      refineArgumentTypes(local_50.this,pFVar10,
                          (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)calls,local_40,
                          pmVar8);
      local_31 = refineReturnTypes(local_50.this,pFVar10,
                                   (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)calls,
                                   local_40);
      __l._M_len = 1;
      __l._M_array = (iterator)&local_b8;
      local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)pFVar10;
      std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
                ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)auStack_98,__l,
                 (allocator_type *)&local_60);
      local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ParamUtils::applyConstantValues
                ((SortedVector *)&scanner.numParams,
                 (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)auStack_98,
                 (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)calls,
                 (vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)&local_78,local_40);
      local_31 = local_31 | (byte)uVar21;
      std::_Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::~_Vector_base
                ((_Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)&local_78);
      std::_Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>::~_Vector_base
                ((_Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)auStack_98);
      pp_Var5 = changed._M_h._M_buckets;
      for (pp_Var17 = (__buckets_ptr)scanner._280_8_; pp_Var17 != pp_Var5;
          pp_Var17 = (__buckets_ptr)((long)pp_Var17 + 4)) {
        x = *(Index *)pp_Var17;
        pmVar8 = std::__detail::
                 _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)pp_Var18,(key_type *)p_Var16);
        SortedVector::insert(&pmVar8->unusedParams,x);
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&scanner.numParams);
      uVar21 = CONCAT71((int7)((ulong)extraout_RAX >> 8),local_31) & 0xffffffff;
      p_Var11 = local_48;
    }
  }
  if ((uVar21 & 1) != 0) {
    ReFinalize::ReFinalize((ReFinalize *)&scanner.numParams);
    WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
    ::run((WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
           *)&scanner.numParams,((local_50.this)->super_Pass).runner,local_40);
    ReFinalize::~ReFinalize((ReFinalize *)&scanner.numParams);
  }
  local_48 = (_Rb_tree_node_base *)CONCAT44(local_48._4_4_,(int)uVar21);
  scanner._280_8_ = &changed._M_h._M_rehash_policy._M_next_resize;
  changed._M_h._M_buckets = (__buckets_ptr)0x1;
  changed._M_h._M_bucket_count = 0;
  changed._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  changed._M_h._M_element_count._0_4_ = 0x3f800000;
  changed._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  changed._M_h._M_rehash_policy._4_4_ = 0;
  changed._M_h._M_rehash_policy._M_next_resize = 0;
  for (p_Var13 = allCalls._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      pp_Var18 = &tailCallees._M_h._M_single_bucket, p_Var13 != (_Rb_tree_node_base *)&allCalls;
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
    pmVar8 = std::__detail::
             _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)pp_Var18,(key_type *)(p_Var13 + 1));
    if (((pmVar8->hasUnseenCalls)._M_base._M_i & 1U) == 0) {
      local_60 = Module::getFunction(local_40,(Name)*(string_view *)(p_Var13 + 1));
      sVar12 = Function::getNumParams(local_60);
      if (sVar12 != 0) {
        allCalls._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_60;
        __l_00._M_len = 1;
        __l_00._M_array = (iterator)&allCalls._M_t._M_impl.super__Rb_tree_header._M_node_count;
        std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
                  ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&local_78,__l_00,
                   (allocator_type *)((long)&func_1 + 7));
        pmVar8 = std::__detail::
                 _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)pp_Var18,(key_type *)(p_Var13 + 1));
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_178,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)pmVar8);
        local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ParamUtils::removeParameters
                  ((SortedVector *)auStack_98,
                   (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&local_78,
                   (SortedVector *)&local_178,
                   (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)&p_Var13[1]._M_left,
                   (vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)&local_b8,local_40,
                   ((local_50.this)->super_Pass).runner);
        std::_Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::~_Vector_base
                  (&local_b8);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_178);
        std::_Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>::~_Vector_base
                  (&local_78);
        if (auStack_98 !=
            (undefined1  [8])
            removedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          std::__detail::
          _Insert_base<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::insert((_Insert_base<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)&scanner.numParams,&local_60);
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_98);
      }
    }
  }
  if (changed._M_h._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
    puVar1 = (local_40->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pp_Var18 = &tailCallees._M_h._M_single_bucket;
    for (puVar19 = (local_40->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar19 != puVar1;
        puVar19 = puVar19 + 1) {
      SVar22 = HeapType::getSignature
                         (&((puVar19->_M_t).
                            super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                            .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->type);
      if (SVar22.results.id.id != 0) {
        pFVar10 = (puVar19->_M_t).
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        auStack_98 = *(undefined1 (*) [8])&(pFVar10->super_Importable).super_Named;
        removedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             *(pointer *)((long)&(pFVar10->super_Importable).super_Named + 8);
        pmVar8 = std::__detail::
                 _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)pp_Var18,(key_type *)auStack_98);
        if ((((((pmVar8->hasUnseenCalls)._M_base._M_i & 1U) == 0) &&
             (pmVar8 = std::__detail::
                       _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)pp_Var18,(key_type *)auStack_98),
             pmVar8->hasTailCalls == false)) &&
            (sVar14 = std::
                      _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                               *)local_160,(key_type *)auStack_98), sVar14 == 0)) &&
           ((iVar15 = std::
                      _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                      ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                              *)&infoMap._M_h._M_single_bucket,(key_type *)auStack_98),
            iVar15._M_node != (_Base_ptr)&allCalls &&
            (bVar7 = std::
                     all_of<__gnu_cxx::__normal_iterator<wasm::Call**,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>,wasm::DAE::iteration(wasm::Module*)::_lambda(wasm::Call*)_1_>
                               ((__normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                                 )iVar15._M_node[1]._M_left,
                                (__normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                                 )iVar15._M_node[1]._M_right,local_50), bVar7)))) {
          removeReturnValue(local_50.this,
                            (puVar19->_M_t).
                            super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                            .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                            (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)
                            &iVar15._M_node[1]._M_left,local_40);
          local_78._M_impl.super__Vector_impl_data._M_start =
               (pointer)(puVar19->_M_t).
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          std::__detail::
          _Insert<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
          ::insert((_Insert<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                    *)&scanner.numParams,(value_type *)&local_78);
        }
      }
    }
  }
  p_Var11 = local_48;
  if ((changed._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0 & (local_50.this)->optimize) ==
      1) {
    OptUtils::optimizeAfterInlining
              ((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                *)&scanner.numParams,local_40,((local_50.this)->super_Pass).runner);
  }
  bVar7 = changed._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0;
  std::
  _Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&scanner.numParams);
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_160);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
               *)&infoMap._M_h._M_single_bucket);
  WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>::
  ~WalkerPass((WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
               *)local_3d8);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&tailCallees._M_h._M_single_bucket);
  return (bool)((byte)p_Var11 & 1 | bVar7);
}

Assistant:

bool iteration(Module* module) {
    allDroppedCalls.clear();

    DAEFunctionInfoMap infoMap;
    // Ensure they all exist so the parallel threads don't modify the data
    // structure.
    for (auto& func : module->functions) {
      infoMap[func->name];
    }
    DAEScanner scanner(&infoMap);
    scanner.walkModuleCode(module);
    for (auto& curr : module->exports) {
      if (curr->kind == ExternalKind::Function) {
        infoMap[curr->value].hasUnseenCalls = true;
      }
    }
    // Scan all the functions.
    scanner.run(getPassRunner(), module);
    // Combine all the info.
    std::map<Name, std::vector<Call*>> allCalls;
    std::unordered_set<Name> tailCallees;
    for (auto& [_, info] : infoMap) {
      for (auto& [name, calls] : info.calls) {
        auto& allCallsToName = allCalls[name];
        allCallsToName.insert(allCallsToName.end(), calls.begin(), calls.end());
      }
      for (auto& callee : info.tailCallees) {
        tailCallees.insert(callee);
      }
      for (auto& [name, calls] : info.droppedCalls) {
        allDroppedCalls[name] = calls;
      }
    }
    // If we refine return types then we will need to do more type updating
    // at the end.
    bool refinedReturnTypes = false;
    // We now have a mapping of all call sites for each function, and can look
    // for optimization opportunities.
    for (auto& [name, calls] : allCalls) {
      // We can only optimize if we see all the calls and can modify them.
      if (infoMap[name].hasUnseenCalls) {
        continue;
      }
      auto* func = module->getFunction(name);
      // Refine argument types before doing anything else. This does not
      // affect whether an argument is used or not, it just refines the type
      // where possible.
      refineArgumentTypes(func, calls, module, infoMap[name]);
      // Refine return types as well.
      if (refineReturnTypes(func, calls, module)) {
        refinedReturnTypes = true;
      }
      auto optimizedIndexes =
        ParamUtils::applyConstantValues({func}, calls, {}, module);
      for (auto i : optimizedIndexes) {
        // Mark it as unused, which we know it now is (no point to re-scan just
        // for that).
        infoMap[name].unusedParams.insert(i);
      }
    }
    if (refinedReturnTypes) {
      // Changing a call expression's return type can propagate out to its
      // parents, and so we must refinalize.
      // TODO: We could track in which functions we actually make changes.
      ReFinalize().run(getPassRunner(), module);
    }
    // Track which functions we changed, and optimize them later if necessary.
    std::unordered_set<Function*> changed;
    // We now know which parameters are unused, and can potentially remove them.
    for (auto& [name, calls] : allCalls) {
      if (infoMap[name].hasUnseenCalls) {
        continue;
      }
      auto* func = module->getFunction(name);
      auto numParams = func->getNumParams();
      if (numParams == 0) {
        continue;
      }
      auto removedIndexes = ParamUtils::removeParameters(
        {func}, infoMap[name].unusedParams, calls, {}, module, getPassRunner());
      if (!removedIndexes.empty()) {
        // Success!
        changed.insert(func);
      }
    }
    // We can also tell which calls have all their return values dropped. Note
    // that we can't do this if we changed anything so far, as we may have
    // modified allCalls (we can't modify a call site twice in one iteration,
    // once to remove a param, once to drop the return value).
    if (changed.empty()) {
      for (auto& func : module->functions) {
        if (func->getResults() == Type::none) {
          continue;
        }
        auto name = func->name;
        if (infoMap[name].hasUnseenCalls) {
          continue;
        }
        if (infoMap[name].hasTailCalls) {
          continue;
        }
        if (tailCallees.count(name)) {
          continue;
        }
        auto iter = allCalls.find(name);
        if (iter == allCalls.end()) {
          continue;
        }
        auto& calls = iter->second;
        bool allDropped =
          std::all_of(calls.begin(), calls.end(), [&](Call* call) {
            return allDroppedCalls.count(call);
          });
        if (!allDropped) {
          continue;
        }
        removeReturnValue(func.get(), calls, module);
        // TODO Removing a drop may also open optimization opportunities in the
        // callers.
        changed.insert(func.get());
      }
    }
    if (optimize && !changed.empty()) {
      OptUtils::optimizeAfterInlining(changed, module, getPassRunner());
    }
    return !changed.empty() || refinedReturnTypes;
  }